

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-error.c
# Opt level: O0

int run_test_error_message(void)

{
  int iVar1;
  char *pcVar2;
  void *eval_b_5;
  void *eval_a_5;
  void *eval_b_4;
  void *eval_a_4;
  void *eval_b_3;
  void *eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  void *eval_b;
  void *eval_a;
  char buf [32];
  
  pcVar2 = (char *)uv_strerror(0);
  iVar1 = strcmp(pcVar2,"Success");
  if (iVar1 == 0) {
    pcVar2 = (char *)uv_strerror(0xffffffea);
    pcVar2 = strstr(pcVar2,"Success");
    if (pcVar2 != (char *)0x0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-error.c"
              ,0x35,"strstr(uv_strerror(UV_EINVAL), \"Success\")","==","NULL",pcVar2,"==",0);
      abort();
    }
    pcVar2 = (char *)uv_strerror(0x539);
    iVar1 = strcmp(pcVar2,"Unknown error");
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-error.c"
              ,0x36,"strcmp(uv_strerror(1337), \"Unknown error\")","==","0",(long)iVar1,"==",0);
      abort();
    }
    pcVar2 = (char *)uv_strerror(0xfffffac7);
    iVar1 = strcmp(pcVar2,"Unknown error");
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-error.c"
              ,0x37,"strcmp(uv_strerror(-1337), \"Unknown error\")","==","0",(long)iVar1,"==",0);
      abort();
    }
    pcVar2 = (char *)uv_strerror_r(0xffffffea,&eval_a,0x20);
    pcVar2 = strstr(pcVar2,"Success");
    if (pcVar2 != (char *)0x0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-error.c"
              ,0x39,"strstr(uv_strerror_r(UV_EINVAL, buf, sizeof(buf)), \"Success\")","==","NULL",
              pcVar2,"==",0);
      abort();
    }
    pcVar2 = (char *)uv_strerror_r(0x539,&eval_a,0x20);
    pcVar2 = strstr(pcVar2,"1337");
    if (pcVar2 == (char *)0x0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-error.c"
              ,0x3a,"strstr(uv_strerror_r(1337, buf, sizeof(buf)), \"1337\")","!=","NULL",0,"!=",0);
      abort();
    }
    pcVar2 = (char *)uv_strerror_r(0xfffffac7,&eval_a,0x20);
    pcVar2 = strstr(pcVar2,"-1337");
    if (pcVar2 == (char *)0x0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-error.c"
              ,0x3b,"strstr(uv_strerror_r(-1337, buf, sizeof(buf)), \"-1337\")","!=","NULL",0,"!=",0
             );
      abort();
    }
  }
  else {
    printf("i18n error messages detected, skipping test.\n");
  }
  return 0;
}

Assistant:

TEST_IMPL(error_message) {
#if defined(__ASAN__)
  RETURN_SKIP("Test does not currently work in ASAN");
#endif
  char buf[32];

  /* Cop out. Can't do proper checks on systems with
   * i18n-ized error messages...
   */
  if (strcmp(uv_strerror(0), "Success") != 0) {
    printf("i18n error messages detected, skipping test.\n");
    return 0;
  }

  ASSERT_NULL(strstr(uv_strerror(UV_EINVAL), "Success"));
  ASSERT_OK(strcmp(uv_strerror(1337), "Unknown error"));
  ASSERT_OK(strcmp(uv_strerror(-1337), "Unknown error"));

  ASSERT_NULL(strstr(uv_strerror_r(UV_EINVAL, buf, sizeof(buf)), "Success"));
  ASSERT_NOT_NULL(strstr(uv_strerror_r(1337, buf, sizeof(buf)), "1337"));
  ASSERT_NOT_NULL(strstr(uv_strerror_r(-1337, buf, sizeof(buf)), "-1337"));

  return 0;
}